

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O0

void __thiscall pg::MSPMSolver::MSPMSolver(MSPMSolver *this,Oink *oink,Game *game)

{
  Game *game_local;
  Oink *oink_local;
  MSPMSolver *this_local;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__MSPMSolver_002c7980;
  this->iterations = 0;
  this->lift_attempt = 0;
  this->lift_count = 0;
  std::deque<int,_std::allocator<int>_>::deque(&this->todo);
  std::vector<int,_std::allocator<int>_>::vector(&this->looping);
  return;
}

Assistant:

MSPMSolver::MSPMSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}